

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_message.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::csharp::MessageGenerator::MessageGenerator
          (MessageGenerator *this,Descriptor *descriptor,Options *options)

{
  __normal_iterator<const_google::protobuf::FieldDescriptor_**,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
  __first;
  __normal_iterator<const_google::protobuf::FieldDescriptor_**,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
  __last;
  long lVar1;
  bool bVar2;
  ulong uVar3;
  FieldDescriptor *descriptor_00;
  int iVar4;
  Descriptor *this_00;
  uint uVar5;
  FieldDescriptor *local_30;
  
  SourceGeneratorBase::SourceGeneratorBase(&this->super_SourceGeneratorBase,options);
  (this->super_SourceGeneratorBase)._vptr_SourceGeneratorBase =
       (_func_int **)&PTR__MessageGenerator_0051f470;
  this->descriptor_ = descriptor;
  (this->fields_by_number_).
  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->fields_by_number_).
  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined8 *)
   ((long)&(this->fields_by_number_).
           super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
           ._M_impl.super__Vector_impl_data._M_finish + 4) = 0;
  *(undefined8 *)
   ((long)&(this->fields_by_number_).
           super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + 4) = 0;
  this->has_extension_ranges_ = 0 < *(int *)(descriptor + 0x88);
  if (0 < *(int *)(descriptor + 4)) {
    iVar4 = 0;
    do {
      local_30 = Descriptor::field(descriptor,iVar4);
      std::
      vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
      ::emplace_back<google::protobuf::FieldDescriptor_const*>
                ((vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
                  *)&this->fields_by_number_,&local_30);
      iVar4 = iVar4 + 1;
      descriptor = this->descriptor_;
    } while (iVar4 < *(int *)(descriptor + 4));
  }
  __first._M_current =
       (this->fields_by_number_).
       super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
       ._M_impl.super__Vector_impl_data._M_start;
  __last._M_current =
       (this->fields_by_number_).
       super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (__first._M_current != __last._M_current) {
    uVar3 = (long)__last._M_current - (long)__first._M_current >> 3;
    lVar1 = 0x3f;
    if (uVar3 != 0) {
      for (; uVar3 >> lVar1 == 0; lVar1 = lVar1 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<google::protobuf::FieldDescriptor_const**,std::vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(google::protobuf::FieldDescriptor_const*,google::protobuf::FieldDescriptor_const*)>>
              (__first,__last,(ulong)(((uint)lVar1 ^ 0x3f) * 2) ^ 0x7e,
               (_Iter_comp_iter<bool_(*)(const_google::protobuf::FieldDescriptor_*,_const_google::protobuf::FieldDescriptor_*)>
                )0x2409f8);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<google::protobuf::FieldDescriptor_const**,std::vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>>,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(google::protobuf::FieldDescriptor_const*,google::protobuf::FieldDescriptor_const*)>>
              (__first,__last,
               (_Iter_comp_iter<bool_(*)(const_google::protobuf::FieldDescriptor_*,_const_google::protobuf::FieldDescriptor_*)>
                )0x2409f8);
  }
  this_00 = this->descriptor_;
  if (0 < *(int *)(this_00 + 4)) {
    iVar4 = 0;
    uVar5 = 0;
    do {
      descriptor_00 = Descriptor::field(this_00,iVar4);
      bVar2 = RequiresPresenceBit(descriptor_00);
      if (bVar2) {
        uVar5 = uVar5 + 1;
        if ((this->has_bit_field_count_ == 0) || ((uVar5 & 0x1f) == 0)) {
          this->has_bit_field_count_ = this->has_bit_field_count_ + 1;
        }
      }
      iVar4 = iVar4 + 1;
      this_00 = this->descriptor_;
    } while (iVar4 < *(int *)(this_00 + 4));
  }
  return;
}

Assistant:

MessageGenerator::MessageGenerator(const Descriptor* descriptor,
                                   const Options* options)
    : SourceGeneratorBase(options),
      descriptor_(descriptor),
      has_bit_field_count_(0),
      has_extension_ranges_(descriptor->extension_range_count() > 0) {
  // fields by number
  for (int i = 0; i < descriptor_->field_count(); i++) {
    fields_by_number_.push_back(descriptor_->field(i));
  }
  std::sort(fields_by_number_.begin(), fields_by_number_.end(),
            CompareFieldNumbers);

  int presence_bit_count = 0;
  for (int i = 0; i < descriptor_->field_count(); i++) {
    const FieldDescriptor* field = descriptor_->field(i);
    if (RequiresPresenceBit(field)) {
      presence_bit_count++;
      if (has_bit_field_count_ == 0 || (presence_bit_count % 32) == 0) {
        has_bit_field_count_++;
      }
    }
  }
}